

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.cpp
# Opt level: O0

void rw::writePNG(Image *image,char *filename)

{
  uint32 srcstride;
  FILE *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  uchar *puVar4;
  uint8 *puVar5;
  Error local_274;
  Error _e_1;
  uint32 error;
  uint8 *col_1;
  uint8 *col;
  LodePNGState state;
  uint8 *pixels;
  uint8 *raw;
  size_t rawsize;
  undefined4 local_40;
  Error _e;
  undefined1 local_30 [8];
  StreamFile file;
  int32 i;
  char *filename_local;
  Image *image_local;
  
  StreamFile::StreamFile((StreamFile *)local_30);
  iVar2 = StreamFile::open((StreamFile *)local_30,filename,0x153fdd);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    rawsize._4_4_ = 0;
    local_40 = 0x80000003;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/png.cpp",
            0x58);
    pFVar1 = _stderr;
    pcVar3 = dbgsprint(0x80000003,filename);
    fprintf(pFVar1,"%s\n",pcVar3);
    setError((Error *)((long)&rawsize + 4));
    rawsize._0_4_ = 1;
  }
  else {
    pixels = (uint8 *)0x0;
    lodepng_state_init((LodePNGState *)&col);
    state._496_8_ = image->pixels;
    switch(image->depth) {
    case 4:
      state.encoder._84_4_ = 4;
      state.encoder.text_compression = 3;
      state.info_png._12_4_ = 4;
      state.info_png.interlace_method = 3;
      state.encoder.zlibsettings.custom_context._0_4_ = 0;
      for (file.file._4_4_ = 0; file.file._4_4_ < 1 << ((byte)image->depth & 0x1f);
          file.file._4_4_ = file.file._4_4_ + 1) {
        puVar4 = image->palette + (file.file._4_4_ << 2);
        lodepng_palette_add((LodePNGColorMode *)&state.info_png.interlace_method,*puVar4,puVar4[1],
                            puVar4[2],puVar4[3]);
        lodepng_palette_add((LodePNGColorMode *)&state.encoder.text_compression,*puVar4,puVar4[1],
                            puVar4[2],puVar4[3]);
      }
      state._496_8_ =
           mustmalloc_LOC((long)((image->width / 2) * image->height),0x10018,
                          "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/png.cpp line: 111"
                         );
      srcstride = image->width;
      compressPal4_BE((uint8 *)state._496_8_,(int)srcstride / 2,image->pixels,srcstride,srcstride,
                      image->height);
      break;
    case 8:
      state.encoder.text_compression = 3;
      state.info_png.interlace_method = 3;
      state.encoder.zlibsettings.custom_context._0_4_ = 0;
      for (file.file._4_4_ = 0; file.file._4_4_ < 1 << ((byte)image->depth & 0x1f);
          file.file._4_4_ = file.file._4_4_ + 1) {
        register0x00000000 = image->palette + (file.file._4_4_ << 2);
        lodepng_palette_add((LodePNGColorMode *)&state.info_png.interlace_method,*register0x00000000
                            ,register0x00000000[1],register0x00000000[2],register0x00000000[3]);
        lodepng_palette_add((LodePNGColorMode *)&state.encoder.text_compression,
                            *stack0xfffffffffffffd98,stack0xfffffffffffffd98[1],
                            stack0xfffffffffffffd98[2],stack0xfffffffffffffd98[3]);
      }
      break;
    case 0x10:
      Image::convertTo32(image);
      break;
    case 0x18:
      state.encoder.text_compression = 2;
      state.info_png.interlace_method = 2;
      state.encoder.zlibsettings.custom_context._0_4_ = 0;
      break;
    case 0x20:
    }
    _e_1.plugin = lodepng_encode(&pixels,(size_t *)&raw,(uchar *)state._496_8_,image->width,
                                 image->height,(LodePNGState *)&col);
    if (_e_1.plugin == 0) {
      if ((uint8 *)state._496_8_ != image->pixels) {
        (*DAT_00168638)(state._496_8_);
      }
      puVar5 = pixels;
      StreamFile::write8((StreamFile *)local_30,pixels,(uint32)raw);
      StreamFile::close((StreamFile *)local_30,(int)puVar5);
      free(pixels);
      rawsize._0_4_ = 0;
    }
    else {
      local_274.plugin = 0;
      local_274.code = 0x80000001;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/png.cpp"
              ,0x8d);
      pFVar1 = _stderr;
      pcVar3 = lodepng_error_text(_e_1.plugin);
      pcVar3 = dbgsprint(0x80000001,pcVar3);
      fprintf(pFVar1,"%s\n",pcVar3);
      setError(&local_274);
      rawsize._0_4_ = 1;
    }
  }
  StreamFile::~StreamFile((StreamFile *)local_30);
  return;
}

Assistant:

void
writePNG(Image *image, const char *filename)
{
	int32 i;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}

	size_t rawsize;
	uint8 *raw = nil;
	uint8 *pixels;
	LodePNGState state;
	lodepng_state_init(&state);

	pixels = image->pixels;
	switch(image->depth){
	case 4:
		state.info_raw.bitdepth = 4;
		state.info_raw.colortype = LCT_PALETTE;
		state.info_png.color.bitdepth = 4;
		state.info_png.color.colortype = LCT_PALETTE;
		state.encoder.auto_convert = 0;
		for(i = 0; i < (1<<image->depth); i++){
			uint8 *col = &image->palette[i*4];
			lodepng_palette_add(&state.info_png.color, col[0], col[1], col[2], col[3]);
			lodepng_palette_add(&state.info_raw, col[0], col[1], col[2], col[3]);
		}
		pixels = rwNewT(uint8, image->width/2*image->height, ID_IMAGE | MEMDUR_FUNCTION);
		compressPal4_BE(pixels, image->width/2, image->pixels, image->width, image->width, image->height);
		break;
	case 8:
		state.info_raw.colortype = LCT_PALETTE;
		state.info_png.color.colortype = LCT_PALETTE;
		state.encoder.auto_convert = 0;
		for(i = 0; i < (1<<image->depth); i++){
			uint8 *col = &image->palette[i*4];
			lodepng_palette_add(&state.info_png.color, col[0], col[1], col[2], col[3]);
			lodepng_palette_add(&state.info_raw, col[0], col[1], col[2], col[3]);
		}
		break;
	case 16:
		// Don't think we can have 16 bits with PNG
		// TODO: don't change original image
		image->convertTo32();
		break;
	case 24:
		state.info_raw.colortype = LCT_RGB;
		state.info_png.color.colortype = LCT_RGB;
		state.encoder.auto_convert = 0;
		break;
	case 32:
		// already done
		break;
	}

	uint32 error = lodepng_encode(&raw, &rawsize, pixels, image->width, image->height, &state);
	if(error){
		RWERROR((ERR_GENERAL, lodepng_error_text(error)));
		return;
	}
	if(pixels != image->pixels)
		rwFree(pixels);
	file.write8(raw, rawsize);
	file.close();
	free(raw);
}